

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void __thiscall
PosixRunWriter::write_raw(PosixRunWriter *this,FileId base,uint8_t *start,uint8_t *end)

{
  FileId FVar1;
  uint8_t *__n;
  void *__buf;
  byte bVar2;
  long lVar3;
  byte *__x;
  byte *local_38;
  
  if (end != start) {
    __n = end;
    local_38 = start;
    FVar1 = decompress_single(&local_38);
    write(this,base + FVar1,__buf,(size_t)__n);
    lVar3 = 0;
    bVar2 = 0;
    for (__x = local_38; __x < end; __x = __x + 1) {
      this->out_bytes_ = this->out_bytes_ + 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buffer_,__x);
      if (0x8000000 <
          (ulong)((long)(this->buffer_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
        flush(this);
      }
      lVar3 = lVar3 + (ulong)((*__x & 0x7f) << (bVar2 & 0x1f));
      if ((char)*__x < '\0') {
        bVar2 = bVar2 + 7;
      }
      else {
        this->prev_ = this->prev_ + lVar3 + 1;
        lVar3 = 0;
        bVar2 = 0;
      }
    }
  }
  return;
}

Assistant:

void PosixRunWriter::write_raw(FileId base, uint8_t *start,
                               const uint8_t *end) {
    // Special case: when the range is empty, do nothing.
    if (end == start) {
        return;
    }
    // Decompress the first element and write it.
    uint64_t next = decompress_single(&start);
    write(base + next);

    // Write all the other bytes unchanged, and compute the new last element.
    uint64_t acc = 0;
    uint32_t shift = 0;
    for (const uint8_t *ptr = start; ptr < end; ++ptr) {
        out_bytes_++;
        buffer_.push_back(*ptr);
        if (buffer_.size() > RUN_BUFFER_SIZE) {
            flush();
        }
        acc += (*ptr & 0x7FU) << shift;
        shift += 7U;
        if ((*ptr & 0x80U) == 0) {
            prev_ += acc + 1;
            acc = 0;
            shift = 0;
        }
    }
}